

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

Token slang::parsing::Lexer::stringify
                (Lexer *parentLexer,Token startToken,
                span<slang::parsing::Token,_18446744073709551615UL> bodyTokens,Token endToken)

{
  SourceManager *sourceManager;
  bool bVar1;
  KeywordVersion keywordVersion;
  int iVar2;
  Trivia *pTVar3;
  ulong uVar4;
  undefined4 extraout_var;
  SourceLocation SVar5;
  undefined4 extraout_var_00;
  pointer pTVar6;
  long lVar7;
  short *psVar8;
  long lVar9;
  ulong uVar10;
  EVP_PKEY_CTX *src;
  void *extraout_RDX;
  Info *extraout_RDX_00;
  Trivia *t;
  BumpAllocator *pBVar11;
  void *__arg;
  long lVar12;
  pointer pTVar13;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar14;
  string_view sVar15;
  Token TVar16;
  Token token;
  Token startToken_local;
  SmallVector<char,_40UL> text;
  LexerOptions local_458;
  Diagnostics unused;
  Lexer lexer;
  char *startPtr;
  
  startToken_local.info = startToken.info;
  pTVar6 = bodyTokens._M_ptr;
  text.super_SmallVectorBase<char>.data_ = text.super_SmallVectorBase<char>.firstElement;
  text.super_SmallVectorBase<char>.len = 0;
  text.super_SmallVectorBase<char>.cap = 0x28;
  lexer.alloc = (BumpAllocator *)CONCAT71(lexer.alloc._1_7_,0x22);
  startToken_local._0_8_ = startToken._0_8_;
  SmallVectorBase<char>::emplace_back<char>(&text.super_SmallVectorBase<char>,(char *)&lexer);
  uVar4 = startToken._0_8_ & 0xffff;
  if (uVar4 == 0x15b) {
    lexer.alloc = (BumpAllocator *)CONCAT71(lexer.alloc._1_7_,0x22);
    SmallVectorBase<char>::emplace_back<char>(&text.super_SmallVectorBase<char>,(char *)&lexer);
    lexer.alloc = (BumpAllocator *)CONCAT71(lexer.alloc._1_7_,0x22);
    SmallVectorBase<char>::emplace_back<char>(&text.super_SmallVectorBase<char>,(char *)&lexer);
  }
  iVar2 = (int)uVar4;
  if (bodyTokens._M_extent._M_extent_value._M_extent_value != 0) {
    pTVar13 = pTVar6 + bodyTokens._M_extent._M_extent_value._M_extent_value;
    do {
      unused.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.
      data_ = *(pointer *)pTVar6;
      unused.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.len
           = (size_type)pTVar6->info;
      lexer.alloc = (BumpAllocator *)
                    unused.super_SmallVector<slang::Diagnostic,_2UL>.
                    super_SmallVectorBase<slang::Diagnostic>.data_;
      lexer.diagnostics =
           (Diagnostics *)
           unused.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>
           .len;
      sVar14 = Token::trivia((Token *)&lexer);
      pTVar3 = sVar14._M_ptr;
      if (sVar14._M_extent._M_extent_value._M_extent_value != 0) {
        lVar12 = sVar14._M_extent._M_extent_value._M_extent_value << 4;
        do {
          if ((pTVar3->kind == Whitespace) || (iVar2 == 0x15b && pTVar3->kind == EndOfLine)) {
            sVar15 = Trivia::getRawText(pTVar3);
            SmallVectorBase<char>::append<const_char_*>
                      (&text.super_SmallVectorBase<char>,sVar15._M_str,sVar15._M_str + sVar15._M_len
                      );
          }
          pTVar3 = pTVar3 + 1;
          lVar12 = lVar12 + -0x10;
        } while (lVar12 != 0);
      }
      if ((short)unused.super_SmallVector<slang::Diagnostic,_2UL>.
                 super_SmallVectorBase<slang::Diagnostic>.data_ == 4) {
        sVar15 = Token::rawText((Token *)&unused);
        psVar8 = (short *)sVar15._M_str;
        uVar4 = sVar15._M_len;
        if ((uVar4 < 3) || ((char)psVar8[1] != '\"' || *psVar8 != 0x2222)) {
          SmallVectorBase<char>::append<const_char_*>(&text.super_SmallVectorBase<char>,"\\\"","");
          if (uVar4 == 0) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",1,0);
          }
          lVar12 = 1;
          lVar9 = -1;
          lVar7 = -2;
          bVar1 = false;
        }
        else {
          SmallVectorBase<char>::append<const_char_*>
                    (&text.super_SmallVectorBase<char>,"\\\"\\\"\\\"","");
          bVar1 = true;
          lVar12 = 3;
          lVar9 = -3;
          lVar7 = -6;
        }
        uVar10 = lVar9 + uVar4;
        if (lVar7 + uVar4 <= lVar9 + uVar4) {
          uVar10 = lVar7 + uVar4;
        }
        SmallVectorBase<char>::append<const_char_*>
                  (&text.super_SmallVectorBase<char>,(char *)((long)psVar8 + lVar12),
                   (char *)((long)psVar8 + lVar12) + uVar10);
        if (bVar1) {
          SmallVectorBase<char>::append<const_char_*>
                    (&text.super_SmallVectorBase<char>,"\\\"\\\"\\\"","");
        }
        else {
          SmallVectorBase<char>::append<const_char_*>(&text.super_SmallVectorBase<char>,"\\\"","");
        }
      }
      else if ((short)unused.super_SmallVector<slang::Diagnostic,_2UL>.
                      super_SmallVectorBase<slang::Diagnostic>.data_ != 0x15e) {
        if ((short)unused.super_SmallVector<slang::Diagnostic,_2UL>.
                   super_SmallVectorBase<slang::Diagnostic>.data_ == 0x15c) {
          lexer.alloc = (BumpAllocator *)CONCAT71(lexer.alloc._1_7_,0x5c);
          SmallVectorBase<char>::emplace_back<char>
                    (&text.super_SmallVectorBase<char>,(char *)&lexer);
          lexer.alloc = (BumpAllocator *)CONCAT71(lexer.alloc._1_7_,0x22);
          SmallVectorBase<char>::emplace_back<char>
                    (&text.super_SmallVectorBase<char>,(char *)&lexer);
        }
        else {
          sVar15 = Token::rawText((Token *)&unused);
          SmallVectorBase<char>::append<const_char_*>
                    (&text.super_SmallVectorBase<char>,sVar15._M_str,sVar15._M_str + sVar15._M_len);
        }
      }
      pTVar6 = pTVar6 + 1;
    } while (pTVar6 != pTVar13);
  }
  if (endToken.info != (Info *)0x0) {
    lexer.alloc = (BumpAllocator *)endToken._0_8_;
    lexer.diagnostics = (Diagnostics *)endToken.info;
    sVar14 = Token::trivia((Token *)&lexer);
    pTVar3 = sVar14._M_ptr;
    if (sVar14._M_extent._M_extent_value._M_extent_value != 0) {
      lVar12 = sVar14._M_extent._M_extent_value._M_extent_value << 4;
      do {
        if ((pTVar3->kind == Whitespace) || (iVar2 == 0x15b && pTVar3->kind == EndOfLine)) {
          sVar15 = Trivia::getRawText(pTVar3);
          SmallVectorBase<char>::append<const_char_*>
                    (&text.super_SmallVectorBase<char>,sVar15._M_str,sVar15._M_str + sVar15._M_len);
        }
        pTVar3 = pTVar3 + 1;
        lVar12 = lVar12 + -0x10;
      } while (lVar12 != 0);
    }
  }
  if (iVar2 == 0x15b) {
    lexer.alloc = (BumpAllocator *)CONCAT71(lexer.alloc._1_7_,0x22);
    SmallVectorBase<char>::emplace_back<char>(&text.super_SmallVectorBase<char>,(char *)&lexer);
    lexer.alloc = (BumpAllocator *)CONCAT71(lexer.alloc._1_7_,0x22);
    SmallVectorBase<char>::emplace_back<char>(&text.super_SmallVectorBase<char>,(char *)&lexer);
  }
  lexer.alloc = (BumpAllocator *)CONCAT71(lexer.alloc._1_7_,0x22);
  SmallVectorBase<char>::emplace_back<char>(&text.super_SmallVectorBase<char>,(char *)&lexer);
  lexer.alloc = (BumpAllocator *)((ulong)lexer.alloc & 0xffffffffffffff00);
  SmallVectorBase<char>::emplace_back<char>(&text.super_SmallVectorBase<char>,(char *)&lexer);
  iVar2 = SmallVectorBase<char>::copy
                    (&text.super_SmallVectorBase<char>,(EVP_PKEY_CTX *)parentLexer->alloc,src);
  startPtr = (char *)CONCAT44(extraout_var,iVar2);
  unused.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)unused.super_SmallVector<slang::Diagnostic,_2UL>.
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  unused.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.len = 0;
  unused.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  pBVar11 = parentLexer->alloc;
  sourceManager = parentLexer->sourceManager;
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  ::table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                *)&parentLexer->options,
               (allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>
                *)&token);
  local_458.maxErrors = (parentLexer->options).maxErrors;
  local_458.languageVersion = (parentLexer->options).languageVersion;
  local_458.enableLegacyProtect = (parentLexer->options).enableLegacyProtect;
  sVar15._M_str = startPtr;
  sVar15._M_len = (size_t)extraout_RDX;
  Lexer(&lexer,(BufferID)0xffffffff,sVar15,startPtr,pBVar11,&unused,sourceManager,&local_458);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                 *)&local_458);
  keywordVersion = LexerFacts::getDefaultKeywordVersion(lexer.options.languageVersion);
  token = lex(&lexer,keywordVersion);
  pBVar11 = parentLexer->alloc;
  sVar14 = Token::trivia(&startToken_local);
  SVar5 = Token::location(&startToken_local);
  __arg = (void *)((long)extraout_RDX - 1);
  if (extraout_RDX < __arg) {
    __arg = extraout_RDX;
  }
  TVar16._0_4_ = Token::clone(&token,(__fn *)pBVar11,sVar14._M_ptr,
                              (int)sVar14._M_extent._M_extent_value,__arg,startPtr,SVar5);
  TVar16.rawLen = extraout_var_00;
  if (lexer.stringBuffer.super_SmallVectorBase<char>.data_ !=
      lexer.stringBuffer.super_SmallVectorBase<char>.firstElement) {
    operator_delete(lexer.stringBuffer.super_SmallVectorBase<char>.data_);
  }
  if (lexer.triviaBuffer.super_SmallVectorBase<slang::parsing::Trivia>.data_ !=
      (pointer)lexer.triviaBuffer.super_SmallVectorBase<slang::parsing::Trivia>.firstElement) {
    operator_delete(lexer.triviaBuffer.super_SmallVectorBase<slang::parsing::Trivia>.data_);
  }
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                 *)&lexer.options);
  SmallVectorBase<slang::Diagnostic>::cleanup
            ((SmallVectorBase<slang::Diagnostic> *)&unused,(EVP_PKEY_CTX *)pBVar11);
  if (text.super_SmallVectorBase<char>.data_ != text.super_SmallVectorBase<char>.firstElement) {
    operator_delete(text.super_SmallVectorBase<char>.data_);
  }
  TVar16.info = extraout_RDX_00;
  return TVar16;
}

Assistant:

Token Lexer::stringify(Lexer& parentLexer, Token startToken, std::span<Token> bodyTokens,
                       Token endToken) {
    SmallVector<char> text;
    text.push_back('"');

    const bool tripleQuoted = startToken.kind == TokenKind::MacroTripleQuote;
    if (tripleQuoted) {
        text.push_back('"');
        text.push_back('"');
    }

    auto addTrivia = [&](Token cur) {
        for (const Trivia& t : cur.trivia()) {
            if (t.kind == TriviaKind::Whitespace ||
                (tripleQuoted && t.kind == TriviaKind::EndOfLine)) {
                text.append_range(t.getRawText());
            }
        }
    };

    for (auto cur : bodyTokens) {
        addTrivia(cur);

        if (cur.kind == TokenKind::MacroEscapedQuote) {
            text.push_back('\\');
            text.push_back('"');
        }
        else if (cur.kind == TokenKind::StringLiteral) {
            auto raw = cur.rawText();
            const bool nestedHasTriple = raw.starts_with("\"\"\""sv);
            if (nestedHasTriple) {
                text.append_range(R"(\"\"\")"sv);
                raw = raw.substr(3, raw.size() - 6);
            }
            else {
                text.append_range(R"(\")"sv);
                raw = raw.substr(1, raw.size() - 2);
            }

            text.append_range(raw);

            if (nestedHasTriple)
                text.append_range(R"(\"\"\")"sv);
            else
                text.append_range(R"(\")"sv);
        }
        else if (cur.kind != TokenKind::EmptyMacroArgument) {
            text.append_range(cur.rawText());
        }
    }

    if (endToken)
        addTrivia(endToken);

    if (tripleQuoted) {
        text.push_back('"');
        text.push_back('"');
    }

    text.push_back('"');
    text.push_back('\0');

    std::string_view raw = toStringView(text.copy(parentLexer.alloc));

    Diagnostics unused;
    Lexer lexer{BufferID::getPlaceholder(), raw,    raw.data(),
                parentLexer.alloc,          unused, parentLexer.sourceManager,
                parentLexer.options};

    auto token = lexer.lex();
    SLANG_ASSERT(token.kind == TokenKind::StringLiteral);
    SLANG_ASSERT(lexer.lex().kind == TokenKind::EndOfFile);

    return token.clone(parentLexer.alloc, startToken.trivia(), raw.substr(0, raw.length() - 1),
                       startToken.location());
}